

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O2

void ExUtilDeleteCommandLineArguments(CommandLineArguments *args)

{
  if (args != (CommandLineArguments *)0x0) {
    if (args->own_argv != 0) {
      WebPFree(args->argv);
      WebPFree((args->argv_data).bytes);
    }
    args->argc = 0;
    args->argv = (char **)0x0;
    (args->argv_data).bytes = (uint8_t *)0x0;
    *(undefined8 *)((long)&(args->argv_data).bytes + 4) = 0;
    *(undefined8 *)((long)&(args->argv_data).size + 4) = 0;
  }
  return;
}

Assistant:

void ExUtilDeleteCommandLineArguments(CommandLineArguments* const args) {
  if (args != NULL) {
    if (args->own_argv) {
      WebPFree((void*)args->argv);
      WebPDataClear(&args->argv_data);
    }
    ResetCommandLineArguments(0, NULL, args);
  }
}